

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O3

int ReadF0(char *filename,double *temporal_positions,double *f0)

{
  undefined1 auVar1 [16];
  int iVar2;
  FILE *__stream;
  ulong uVar3;
  size_t __n;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double frame_period;
  int number_of_frames;
  char data_check [5];
  double local_40;
  int local_34;
  undefined1 local_2d [5];
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    puts("File cannot be opened.");
  }
  else {
    iVar2 = anon_unknown.dwarf_9e69::CheckHeader((FILE *)__stream,"F0  ");
    if (iVar2 != 0) {
      fread(local_2d,1,4,__stream);
      fread(&local_34,4,1,__stream);
      fread(local_2d,1,4,__stream);
      fread(&local_40,8,1,__stream);
      __n = (size_t)local_34;
      fread(f0,8,__n,__stream);
      fclose(__stream);
      auVar1 = _DAT_0010b210;
      if (0 < (long)__n) {
        lVar4 = __n - 1;
        auVar5._8_4_ = (int)lVar4;
        auVar5._0_8_ = lVar4;
        auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
        uVar3 = 0;
        auVar5 = auVar5 ^ _DAT_0010b210;
        auVar6 = _DAT_0010b200;
        do {
          auVar7 = auVar6 ^ auVar1;
          if ((bool)(~(auVar7._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar7._0_4_ ||
                      auVar5._4_4_ < auVar7._4_4_) & 1)) {
            temporal_positions[uVar3] = ((double)(int)uVar3 / 1000.0) * local_40;
          }
          if ((auVar7._12_4_ != auVar5._12_4_ || auVar7._8_4_ <= auVar5._8_4_) &&
              auVar7._12_4_ <= auVar5._12_4_) {
            temporal_positions[uVar3 + 1] = ((double)((int)uVar3 + 1) / 1000.0) * local_40;
          }
          uVar3 = uVar3 + 2;
          lVar4 = auVar6._8_8_;
          auVar6._0_8_ = auVar6._0_8_ + 2;
          auVar6._8_8_ = lVar4 + 2;
        } while ((local_34 + 1U & 0xfffffffe) != uVar3);
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

int ReadF0(const char *filename, double *temporal_positions, double *f0) {
  FILE *fp = fopen(filename, "rb");
  if (NULL == fp) {
    printf("File cannot be opened.\n");
    return 0;
  }

  // Header
  if (CheckHeader(fp, "F0  ") == 0) return 0;

  // Parameters
  char data_check[5];
  fread(data_check, 1, 4, fp);  // "NOF "
  int number_of_frames;
  fread(&number_of_frames, 4, 1, fp);

  fread(data_check, 1, 4, fp);  // "FP  "
  double frame_period;
  fread(&frame_period, 8, 1, fp);

  // Data
  fread(f0, 8, number_of_frames, fp);

  fclose(fp);
  for (int i = 0; i < number_of_frames; ++i)
    temporal_positions[i] = i / 1000.0 * frame_period;
  return 1;
}